

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
glcts::anon_unknown_0::ComputeShaderBase::ValidateReadBuffer
          (ComputeShaderBase *this,int x,int y,int w,int h,vec4 *expected)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined4 in_register_0000000c;
  float *pfVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  allocator_type local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> display;
  
  pfVar4 = (float *)CONCAT44(in_register_0000000c,w);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&display,(long)(y * x),(allocator_type *)&data);
  uVar10 = y * x * 4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,(long)(int)uVar10,&local_59);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,x,y,0x1908,0x1401,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (0 < (int)uVar10) {
    uVar5 = 0;
    do {
      bVar1 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5 + 1];
      bVar2 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5 + 2];
      bVar3 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5 + 3];
      iVar6 = (int)uVar5 >> 2;
      display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar6].m_data[0] =
           (float)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5] / 255.0;
      display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar6].m_data[1] = (float)bVar1 / 255.0;
      display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar6].m_data[2] = (float)bVar2 / 255.0;
      display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar6].m_data[3] = (float)bVar3 / 255.0;
      uVar5 = uVar5 + 4;
    } while (uVar5 < uVar10);
  }
  bVar9 = y < 1;
  if (0 < y) {
    lVar7 = 0;
    iVar6 = 0;
    do {
      if (0 < x) {
        uVar5 = 0;
        do {
          iVar8 = (int)lVar7 + (int)uVar5;
          fVar11 = display.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[0] - *pfVar4;
          fVar12 = -fVar11;
          if (-fVar11 <= fVar11) {
            fVar12 = fVar11;
          }
          if ((this->g_color_eps).m_data[0] < fVar12) {
LAB_00c1edb5:
            anon_unknown_0::Output
                      ("Color at (%d, %d) is [%f, %f, %f, %f] should be [%f, %f, %f, %f].\n",
                       (double)display.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[0],
                       (double)display.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[1],
                       (double)display.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[2],
                       (double)display.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[3],
                       (double)*pfVar4,(double)pfVar4[1],(double)pfVar4[2],(double)pfVar4[3]);
            goto LAB_00c1ee02;
          }
          fVar11 = display.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[1] - pfVar4[1];
          fVar12 = -fVar11;
          if (-fVar11 <= fVar11) {
            fVar12 = fVar11;
          }
          if ((this->g_color_eps).m_data[1] < fVar12) goto LAB_00c1edb5;
          fVar11 = display.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[2] - pfVar4[2];
          fVar12 = -fVar11;
          if (-fVar11 <= fVar11) {
            fVar12 = fVar11;
          }
          if ((this->g_color_eps).m_data[2] < fVar12) goto LAB_00c1edb5;
          fVar11 = display.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[3] - pfVar4[3];
          fVar12 = -fVar11;
          if (-fVar11 <= fVar11) {
            fVar12 = fVar11;
          }
          if ((this->g_color_eps).m_data[3] < fVar12) goto LAB_00c1edb5;
          uVar5 = uVar5 + 1;
        } while ((uint)x != uVar5);
      }
      iVar6 = iVar6 + 1;
      lVar7 = lVar7 + (ulong)(uint)x;
      bVar9 = y <= iVar6;
    } while (iVar6 != y);
  }
LAB_00c1ee02:
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(display.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)display.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)display.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar9;
}

Assistant:

bool ValidateReadBuffer(int x, int y, int w, int h, const vec4& expected)
	{
		std::vector<vec4>	display(w * h);
		std::vector<GLubyte> data(w * h * 4);
		glReadPixels(x, y, w, h, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);

		for (int i = 0; i < w * h * 4; i += 4)
		{
			display[i / 4] = vec4(static_cast<GLfloat>(data[i] / 255.), static_cast<GLfloat>(data[i + 1] / 255.),
								  static_cast<GLfloat>(data[i + 2] / 255.), static_cast<GLfloat>(data[i + 3] / 255.));
		}

		for (int j = 0; j < h; ++j)
		{
			for (int i = 0; i < w; ++i)
			{
				if (!ColorEqual(display[j * w + i], expected, g_color_eps))
				{
					Output("Color at (%d, %d) is [%f, %f, %f, %f] should be [%f, %f, %f, %f].\n", x + i, y + j,
						   display[j * w + i].x(), display[j * w + i].y(), display[j * w + i].z(),
						   display[j * w + i].w(), expected.x(), expected.y(), expected.z(), expected.w());
					return false;
				}
			}
		}

		return true;
	}